

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

ImGuiTableSettings * ImGui::TableSettingsCreate(ImGuiID id,int columns_count)

{
  ImGuiTableSettings *settings;
  
  settings = ImChunkStream<ImGuiTableSettings>::alloc_chunk
                       (&GImGui->SettingsTables,(long)columns_count * 0x10 + 0x14);
  TableSettingsInit(settings,id,columns_count,columns_count);
  return settings;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsCreate(ImGuiID id, int columns_count)
{
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = g.SettingsTables.alloc_chunk(TableSettingsCalcChunkSize(columns_count));
    TableSettingsInit(settings, id, columns_count, columns_count);
    return settings;
}